

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::EndFunctionBody
          (BinaryReaderInterp *this,Index index)

{
  pointer *ppLVar1;
  Result RVar2;
  Enum EVar3;
  Index keep_count;
  Index drop_count;
  Location loc;
  
  FixupTopLabel(this);
  RVar2 = GetReturnDropKeepCount(this,&drop_count,&keep_count);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    loc.field_1.field_0.last_column = 0;
    loc.filename._M_len = (this->filename_)._M_len;
    loc.filename._M_str = (this->filename_)._M_str;
    loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    RVar2 = SharedValidator::EndFunctionBody(&this->validator_,&loc);
    if (RVar2.enum_ != Error) {
      Istream::EmitDropKeep(this->istream_,drop_count,keep_count);
      Istream::Emit(this->istream_,Return);
      ppLVar1 = &(this->label_stack_).
                 super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppLVar1 = *ppLVar1 + -1;
      this->func_ = (FuncDesc *)0x0;
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::EndFunctionBody(Index index) {
  FixupTopLabel();
  Index drop_count, keep_count;
  CHECK_RESULT(GetReturnDropKeepCount(&drop_count, &keep_count));
  CHECK_RESULT(validator_.EndFunctionBody(GetLocation()));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::Return);
  PopLabel();
  func_ = nullptr;
  return Result::Ok;
}